

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

PatternList *
parse_seq(PatternList *__return_storage_ptr__,Tokens *tokens,
         vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer *ppsVar1;
  pointer *ppsVar2;
  ulong uVar3;
  char *pcVar4;
  int iVar5;
  string *psVar6;
  runtime_error *prVar7;
  char *pcVar8;
  undefined1 __args [8];
  char *pcVar9;
  size_type *psVar10;
  long lVar11;
  char *pcVar12;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *local_a8;
  shared_ptr<docopt::Optional> local_a0;
  char *local_90;
  undefined1 auStack_88 [8];
  PatternList atom;
  PatternList expr;
  string trailing;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = options;
  if (tokens->fIndex <
      (ulong)((long)(tokens->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(tokens->fTokens).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    do {
      psVar10 = &trailing._M_string_length;
      psVar6 = Tokens::current_abi_cxx11_(tokens);
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        return __return_storage_ptr__;
      }
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        return __return_storage_ptr__;
      }
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        return __return_storage_ptr__;
      }
      psVar6 = Tokens::current_abi_cxx11_(tokens);
      auStack_88 = (undefined1  [8])0x0;
      atom.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      atom.
      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        Tokens::pop_abi_cxx11_(&local_c8,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        parse_expr((PatternList *)
                   &atom.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,tokens,local_a8);
        ppsVar1 = &expr.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        Tokens::pop_abi_cxx11_((string *)ppsVar1,tokens);
        iVar5 = std::__cxx11::string::compare((char *)ppsVar1);
        if (iVar5 != 0) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar7,"Mismatched \'[\'");
          *(undefined ***)prVar7 = &PTR__runtime_error_0019bc68;
          __cxa_throw(prVar7,&docopt::DocoptLanguageError::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Optional,std::allocator<docopt::Optional>,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  (&local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Optional **)&local_a0,
                   (allocator<docopt::Optional> *)((long)&trailing.field_2 + 0xf),
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)&atom.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::Optional>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_88,&local_a0);
LAB_00165e9f:
        if (local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (expr.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar10) {
          operator_delete(expr.
                          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
LAB_00165ec2:
        std::
        vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   *)&atom.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar5 == 0) {
          Tokens::pop_abi_cxx11_(&local_128,tokens);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p);
          }
          parse_expr((PatternList *)
                     &atom.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,tokens,local_a8);
          ppsVar1 = &expr.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          Tokens::pop_abi_cxx11_((string *)ppsVar1,tokens);
          iVar5 = std::__cxx11::string::compare((char *)ppsVar1);
          if (iVar5 != 0) {
            prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar7,"Mismatched \'(\'");
            *(undefined ***)prVar7 = &PTR__runtime_error_0019bc68;
            __cxa_throw(prVar7,&docopt::DocoptLanguageError::typeinfo,
                        std::runtime_error::~runtime_error);
          }
          local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<docopt::Required,std::allocator<docopt::Required>,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                    (&local_a0.super___shared_ptr<docopt::Optional,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Required **)&local_a0,
                     (allocator<docopt::Required> *)((long)&trailing.field_2 + 0xf),
                     (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      *)&atom.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::
          vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
          ::emplace_back<std::shared_ptr<docopt::Required>>
                    ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                      *)auStack_88,(shared_ptr<docopt::Required> *)&local_a0);
          goto LAB_00165e9f;
        }
        iVar5 = std::__cxx11::string::compare((char *)psVar6);
        if (iVar5 != 0) {
          trailing._M_dataplus._M_p = (pointer)0x2;
          trailing._M_string_length = CONCAT53(trailing._M_string_length._3_5_,0x2d2d);
          if ((psVar6->_M_string_length < 2) || (*(short *)(psVar6->_M_dataplus)._M_p != 0x2d2d)) {
LAB_00165c9d:
            trailing._M_string_length = CONCAT62(trailing._M_string_length._2_6_,0x2d);
            trailing._M_dataplus._M_p = (pointer)0x1;
            expr.
            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar10;
            if (((psVar6->_M_string_length == 0) || (*(psVar6->_M_dataplus)._M_p != '-')) ||
               (iVar5 = std::__cxx11::string::compare((char *)psVar6), iVar5 == 0)) {
              if (expr.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar10) {
                operator_delete(expr.
                                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)psVar6);
              if (expr.
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar10) {
                operator_delete(expr.
                                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              }
              if (iVar5 != 0) {
                ppsVar1 = &atom.
                           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                parse_short((PatternList *)ppsVar1,tokens,local_a8);
                trailing._M_string_length =
                     (size_type)
                     atom.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                trailing._M_dataplus._M_p =
                     (pointer)atom.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                expr.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_88;
                auStack_88 = (undefined1  [8])
                             atom.
                             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
                atom.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     expr.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
                atom.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     expr.
                     super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                atom.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                expr.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                expr.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                std::
                vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)&expr.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::
                vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                           *)ppsVar1);
                goto LAB_00165ec7;
              }
            }
            uVar3 = psVar6->_M_string_length;
            if (uVar3 == 0) {
LAB_001661f2:
              ppsVar1 = &expr.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              Tokens::pop_abi_cxx11_((string *)ppsVar1,tokens);
              atom.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ppsVar2 = &atom.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Command,std::allocator<docopt::Command>,std::__cxx11::string>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr,(Command **)ppsVar2,
                         (allocator<docopt::Command> *)&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ppsVar1);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Command>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)auStack_88,(shared_ptr<docopt::Command> *)ppsVar2);
            }
            else {
              pcVar4 = (psVar6->_M_dataplus)._M_p;
              if ((*pcVar4 != '<') || (pcVar4[uVar3 - 1] != '>')) {
                pcVar8 = pcVar4 + uVar3;
                pcVar12 = pcVar4;
                if (0 < (long)uVar3 >> 2) {
                  pcVar12 = pcVar4 + (uVar3 & 0xfffffffffffffffc);
                  lVar11 = ((long)uVar3 >> 2) + 1;
                  pcVar9 = pcVar4 + 3;
                  local_90 = pcVar4 + uVar3;
                  do {
                    iVar5 = isupper((int)pcVar9[-3]);
                    if (iVar5 == 0) {
                      pcVar8 = local_90;
                      pcVar9 = pcVar9 + -3;
                      goto LAB_001661ed;
                    }
                    iVar5 = isupper((int)pcVar9[-2]);
                    if (iVar5 == 0) {
                      pcVar8 = local_90;
                      pcVar9 = pcVar9 + -2;
                      goto LAB_001661ed;
                    }
                    iVar5 = isupper((int)pcVar9[-1]);
                    if (iVar5 == 0) {
                      pcVar8 = local_90;
                      pcVar9 = pcVar9 + -1;
                      goto LAB_001661ed;
                    }
                    iVar5 = isupper((int)*pcVar9);
                    pcVar8 = local_90;
                    if (iVar5 == 0) goto LAB_001661ed;
                    lVar11 = lVar11 + -1;
                    pcVar9 = pcVar9 + 4;
                  } while (1 < lVar11);
                }
                lVar11 = (long)pcVar8 - (long)pcVar12;
                if (lVar11 == 1) {
LAB_001661d5:
                  iVar5 = isupper((int)*pcVar12);
                  pcVar9 = pcVar12;
                  if (iVar5 != 0) {
                    pcVar9 = pcVar8;
                  }
                }
                else if (lVar11 == 2) {
LAB_001661bf:
                  iVar5 = isupper((int)*pcVar12);
                  pcVar9 = pcVar12;
                  if (iVar5 != 0) {
                    pcVar12 = pcVar12 + 1;
                    goto LAB_001661d5;
                  }
                }
                else {
                  pcVar9 = pcVar8;
                  if ((lVar11 == 3) &&
                     (iVar5 = isupper((int)*pcVar12), pcVar9 = pcVar12, iVar5 != 0)) {
                    pcVar12 = pcVar12 + 1;
                    goto LAB_001661bf;
                  }
                }
LAB_001661ed:
                if (pcVar9 != pcVar8) goto LAB_001661f2;
              }
              ppsVar1 = &expr.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              Tokens::pop_abi_cxx11_((string *)ppsVar1,tokens);
              atom.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              ppsVar2 = &atom.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<docopt::Argument,std::allocator<docopt::Argument>,std::__cxx11::string>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&expr,(Argument **)ppsVar2,
                         (allocator<docopt::Argument> *)&local_a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ppsVar1);
              std::
              vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
              ::emplace_back<std::shared_ptr<docopt::Argument>>
                        ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                          *)auStack_88,(shared_ptr<docopt::Argument> *)ppsVar2);
            }
            if (expr.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         expr.
                         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
            if (expr.
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                (pointer)&trailing._M_string_length) {
              operator_delete(expr.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            goto LAB_00165ec7;
          }
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)psVar10;
          iVar5 = std::__cxx11::string::compare((char *)psVar6);
          if (expr.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)psVar10) {
            operator_delete(expr.
                            super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          if (iVar5 == 0) goto LAB_00165c9d;
          parse_long((PatternList *)
                     &atom.
                      super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,tokens,local_a8);
          trailing._M_string_length =
               (size_type)
               atom.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          trailing._M_dataplus._M_p =
               (pointer)atom.
                        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_88;
          auStack_88 = (undefined1  [8])
                       atom.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
          atom.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               expr.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          atom.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               expr.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          atom.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          expr.
          super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
          ::~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                     *)&expr.
                        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
          goto LAB_00165ec2;
        }
        Tokens::pop_abi_cxx11_(&local_108,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        expr.
        super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        ppsVar1 = &expr.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::OptionsShortcut,std::allocator<docopt::OptionsShortcut>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&trailing,
                   (OptionsShortcut **)ppsVar1,
                   (_Sp_alloc_shared_tag<std::allocator<docopt::OptionsShortcut>_>)
                   &atom.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::OptionsShortcut>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)auStack_88,(shared_ptr<docopt::OptionsShortcut> *)ppsVar1);
        if (trailing._M_dataplus._M_p != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)trailing._M_dataplus._M_p);
        }
      }
LAB_00165ec7:
      psVar6 = Tokens::current_abi_cxx11_(tokens);
      iVar5 = std::__cxx11::string::compare((char *)psVar6);
      if (iVar5 == 0) {
        local_c8._M_dataplus._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::OneOrMore,std::allocator<docopt::OneOrMore>,std::vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length,
                   (OneOrMore **)&local_c8,
                   (_Sp_alloc_shared_tag<std::allocator<docopt::OneOrMore>_>)
                   &expr.
                    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                    *)auStack_88);
        std::
        vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>::
        emplace_back<std::shared_ptr<docopt::OneOrMore>>
                  ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                    *)__return_storage_ptr__,(shared_ptr<docopt::OneOrMore> *)&local_c8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._M_string_length);
        }
        Tokens::pop_abi_cxx11_(&local_e8,tokens);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
      }
      else {
        lVar11 = (long)atom.
                       super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88 >> 4;
        if (0 < lVar11) {
          lVar11 = lVar11 + 1;
          __args = auStack_88;
          do {
            std::
            vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
            ::emplace_back<std::shared_ptr<docopt::Pattern>>
                      ((vector<std::shared_ptr<docopt::Pattern>,std::allocator<std::shared_ptr<docopt::Pattern>>>
                        *)__return_storage_ptr__,(shared_ptr<docopt::Pattern> *)__args);
            __args = (undefined1  [8])((long)__args + 0x10);
            lVar11 = lVar11 + -1;
          } while (1 < lVar11);
        }
      }
      std::
      vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
      ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               *)auStack_88);
    } while (tokens->fIndex <
             (ulong)((long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(tokens->fTokens).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return __return_storage_ptr__;
}

Assistant:

static PatternList parse_seq(Tokens& tokens, std::vector<Option>& options)
{
	// seq ::= ( atom [ '...' ] )* ;"""

	PatternList ret;

	while (tokens) {
		auto const& token = tokens.current();

		if (token=="]" || token==")" || token=="|")
			break;

		auto atom = parse_atom(tokens, options);
		if (tokens.current() == "...") {
			ret.emplace_back(std::make_shared<OneOrMore>(std::move(atom)));
			tokens.pop();
		} else {
			std::move(atom.begin(), atom.end(), std::back_inserter(ret));
		}
	}

	return ret;
}